

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.h
# Opt level: O0

void __thiscall HighsLp::HighsLp(HighsLp *this)

{
  long in_RDI;
  HighsLp *this_00;
  HighsSparseMatrix *in_stack_ffffffffffffffa0;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x49ea9a);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x49eaad);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x49eac0);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x49ead3);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x49eae6);
  HighsSparseMatrix::HighsSparseMatrix(in_stack_ffffffffffffffa0);
  std::__cxx11::string::string((string *)(in_RDI + 0x100));
  this_00 = (HighsLp *)(in_RDI + 0x120);
  std::__cxx11::string::string((string *)this_00);
  *(undefined4 *)(in_RDI + 0x140) = 0;
  *(undefined4 *)(in_RDI + 0x144) = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x49eb50);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x49eb66);
  std::vector<HighsVarType,_std::allocator<HighsVarType>_>::vector
            ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)0x49eb7c);
  HighsNameHash::HighsNameHash((HighsNameHash *)0x49eb92);
  HighsNameHash::HighsNameHash((HighsNameHash *)0x49eba8);
  HighsScale::HighsScale((HighsScale *)this_00);
  HighsLpMods::HighsLpMods((HighsLpMods *)this_00);
  clear(this_00);
  return;
}

Assistant:

HighsLp() { clear(); }